

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall
slang::CommandLine::addInternal
          (CommandLine *this,string_view name,OptionStorage *storage,string_view desc,
          string_view valueName,bitmask<slang::CommandLineFlags> flags)

{
  bool bVar1;
  element_type *peVar2;
  size_type sVar3;
  const_reference pvVar4;
  invalid_argument *piVar5;
  char *in_RDX;
  size_t in_RSI;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>,_bool>
  pVar8;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  underlying_type in_stack_00000018;
  undefined1 in_stack_00000020 [16];
  string_view in_stack_00000030;
  string_view curr;
  size_t index;
  shared_ptr<slang::CommandLine::Option> option;
  undefined7 in_stack_fffffffffffffdb8;
  char in_stack_fffffffffffffdbf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  size_t in_stack_fffffffffffffdc8;
  vector<std::shared_ptr<slang::CommandLine::Option>,_std::allocator<std::shared_ptr<slang::CommandLine::Option>_>_>
  *in_stack_fffffffffffffdd0;
  undefined6 in_stack_fffffffffffffdd8;
  byte in_stack_fffffffffffffdde;
  byte in_stack_fffffffffffffddf;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>
  in_stack_fffffffffffffde0;
  allocator<char> *__a;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  size_t in_stack_fffffffffffffe10;
  string local_170 [32];
  _Base_ptr local_150;
  byte local_148;
  allocator<char> local_139 [33];
  _Base_ptr local_118;
  byte local_110;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  size_type local_c8;
  underlying_type local_8c;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined1 *local_50;
  char *local_48;
  undefined8 uStack_40;
  basic_string_view<char,_std::char_traits<char>_> *local_30;
  char *local_28;
  undefined8 uStack_20;
  string *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_8c = in_stack_00000018;
  local_78._M_len = in_RSI;
  local_78._M_str = in_RDX;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_78);
  if (bVar1) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Name cannot be empty");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::make_shared<slang::CommandLine::Option>();
  std::__shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x340359);
  std::__cxx11::string::operator=
            (in_stack_fffffffffffffdc0,
             (basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
  std::__shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x34037c);
  std::__cxx11::string::operator=
            (in_stack_fffffffffffffdc0,
             (basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
  std::__shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x34039f);
  std::__cxx11::string::operator=
            (in_stack_fffffffffffffdc0,
             (basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
  std::__shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x3403c2);
  std::
  variant<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<int,_std::allocator<int>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<long,_std::allocator<long>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::operator=((variant<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<int,_std::allocator<int>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<long,_std::allocator<long>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
               *)in_stack_fffffffffffffdc0,
              (variant<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<int,_std::allocator<int>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<long,_std::allocator<long>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
               *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
  peVar2 = std::
           __shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3403df);
  bVar7._M_str = in_stack_fffffffffffffe08;
  bVar7._M_len = in_stack_fffffffffffffe10;
  bVar9._M_str = (char *)in_stack_fffffffffffffdc0;
  bVar9._M_len = in_stack_fffffffffffffdc8;
  (peVar2->flags).m_bits = local_8c;
  while( true ) {
    local_c8 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                         ((basic_string_view<char,_std::char_traits<char>_> *)bVar9._M_str,
                          in_stack_fffffffffffffdbf,0x340404);
    bVar6 = local_e8;
    local_d8 = local_78;
    if (local_c8 != 0xffffffffffffffff) {
      bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffffde0._M_node,
                         CONCAT17(in_stack_fffffffffffffddf,
                                  CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)),
                         (size_type)in_stack_fffffffffffffdd0);
      local_d8 = bVar6;
    }
    local_e8 = bVar6;
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_d8);
    if (sVar3 < 2) break;
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_d8,0);
    if (*pvVar4 != '-') {
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_d8,0);
      if (*pvVar4 != '+') break;
    }
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_d8,0);
    if (*pvVar4 != '+') {
      bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffffde0._M_node,
                         CONCAT17(in_stack_fffffffffffffddf,
                                  CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)),
                         (size_type)in_stack_fffffffffffffdd0);
      local_f8 = bVar6;
      local_d8 = bVar6;
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_d8,0);
      if (*pvVar4 == '-') {
        bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffffde0._M_node,
                           CONCAT17(in_stack_fffffffffffffddf,
                                    CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)),
                           (size_type)in_stack_fffffffffffffdd0);
        local_108 = bVar7;
        local_d8 = bVar7;
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_d8);
        if (bVar1) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar5,"Names must begin with \'-\' or \'--\'");
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      else {
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_d8);
        if (1 < sVar3) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar5,"Long name requires \'--\' prefix");
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
    }
    __a = local_139;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,__a);
    pVar8 = std::
            map<std::__cxx11::string,std::shared_ptr<slang::CommandLine::Option>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<slang::CommandLine::Option>>>>
            ::try_emplace<std::shared_ptr<slang::CommandLine::Option>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>_>
                        *)bVar7._M_len,(key_type *)bVar7._M_str,
                       (shared_ptr<slang::CommandLine::Option> *)in_stack_fffffffffffffe00);
    in_stack_fffffffffffffde0 = pVar8.first._M_node;
    in_stack_fffffffffffffddf = pVar8.second;
    in_stack_fffffffffffffdde = in_stack_fffffffffffffddf ^ 0xff;
    local_150 = in_stack_fffffffffffffde0._M_node;
    local_148 = in_stack_fffffffffffffddf;
    local_118 = in_stack_fffffffffffffde0._M_node;
    local_110 = in_stack_fffffffffffffddf;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar9._M_str);
    std::allocator<char>::~allocator(local_139);
    if ((in_stack_fffffffffffffdde & 1) != 0) {
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_18 = local_170;
      local_28 = "Argument with name \'{}\' already exists";
      uStack_20 = 0x26;
      local_30 = &local_d8;
      local_48 = "Argument with name \'{}\' already exists";
      uStack_40 = 0x26;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                ((value<fmt::v11::context> *)piVar5,
                 (basic_string_view<char,_std::char_traits<char>_> *)bVar9._M_len);
      local_8 = &local_58;
      local_10 = local_68;
      local_58 = 0xd;
      local_50 = local_10;
      ::fmt::v11::vformat_abi_cxx11_(in_stack_00000030,(format_args)in_stack_00000020);
      std::invalid_argument::invalid_argument(piVar5,local_170);
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    if (local_c8 == 0xffffffffffffffff) {
      std::
      vector<std::shared_ptr<slang::CommandLine::Option>,std::allocator<std::shared_ptr<slang::CommandLine::Option>>>
      ::emplace_back<std::shared_ptr<slang::CommandLine::Option>&>
                (in_stack_fffffffffffffdd0,(shared_ptr<slang::CommandLine::Option> *)bVar9._M_len);
      std::shared_ptr<slang::CommandLine::Option>::~shared_ptr
                ((shared_ptr<slang::CommandLine::Option> *)0x340a93);
      return;
    }
    bVar9 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       in_stack_fffffffffffffde0._M_node,
                       CONCAT17(in_stack_fffffffffffffddf,
                                CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)),
                       (size_type)in_stack_fffffffffffffdd0);
    local_78 = bVar9;
  }
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar5,"Names must begin with \'-\', \'+\', or \'--\'");
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void CommandLine::addInternal(std::string_view name, OptionStorage storage, std::string_view desc,
                              std::string_view valueName, bitmask<CommandLineFlags> flags) {
    if (name.empty())
        SLANG_THROW(std::invalid_argument("Name cannot be empty"));

    auto option = std::make_shared<Option>();
    option->desc = desc;
    option->valueName = valueName;
    option->allArgNames = name;
    option->storage = std::move(storage); // NOLINT
    option->flags = flags;

    while (true) {
        size_t index = name.find_first_of(',');
        std::string_view curr = name;
        if (index != std::string_view::npos)
            curr = name.substr(0, index);

        if (curr.length() <= 1 || (curr[0] != '-' && curr[0] != '+'))
            SLANG_THROW(std::invalid_argument("Names must begin with '-', '+', or '--'"));

        if (curr[0] != '+') {
            curr = curr.substr(1);
            if (curr[0] == '-') {
                curr = curr.substr(1);
                if (curr.empty())
                    SLANG_THROW(std::invalid_argument("Names must begin with '-' or '--'"));
            }
            else if (curr.length() > 1) {
                SLANG_THROW(std::invalid_argument("Long name requires '--' prefix"));
            }
        }

        if (!optionMap.try_emplace(std::string(curr), option).second) {
            SLANG_THROW(
                std::invalid_argument(fmt::format("Argument with name '{}' already exists", curr)));
        }

        if (index == std::string_view::npos)
            break;
        name = name.substr(index + 1);
    }

    orderedOptions.emplace_back(option);
}